

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall
StatisticsWriter::writeData
          (StatisticsWriter *this,ostream *stream,DataVector *data,string *delimiter)

{
  bool bVar1;
  pointer pDVar2;
  __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_> local_40
  ;
  __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_> local_38
  ;
  __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_> local_30
  ;
  const_iterator it;
  string *delimiter_local;
  DataVector *data_local;
  ostream *stream_local;
  StatisticsWriter *this_local;
  
  it._M_current = (DataPoint *)delimiter;
  local_30._M_current =
       (DataPoint *)
       std::vector<DataPoint,_std::allocator<DataPoint>_>::begin
                 (&data->super_vector<DataPoint,_std::allocator<DataPoint>_>);
  while( true ) {
    local_38._M_current =
         (DataPoint *)
         std::vector<DataPoint,_std::allocator<DataPoint>_>::end
                   (&data->super_vector<DataPoint,_std::allocator<DataPoint>_>);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>
             ::operator->(&local_30);
    if ((pDVar2->active & 1U) == 0) {
      __gnu_cxx::
      __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>::
      operator++(&local_30);
    }
    else {
      pDVar2 = __gnu_cxx::
               __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>
               ::operator->(&local_30);
      std::ostream::operator<<((ostream *)stream,pDVar2->value);
      __gnu_cxx::
      __normal_iterator<const_DataPoint_*,_std::vector<DataPoint,_std::allocator<DataPoint>_>_>::
      operator++(&local_30);
      local_40._M_current =
           (DataPoint *)
           std::vector<DataPoint,_std::allocator<DataPoint>_>::end
                     (&data->super_vector<DataPoint,_std::allocator<DataPoint>_>);
      bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
      if (bVar1) {
        std::operator<<((ostream *)stream,(string *)delimiter);
      }
    }
  }
  std::ostream::operator<<((ostream *)stream,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
    writeData(std::ostream & stream,
              DataVector const & data,
              std::string const delimiter = " ")
    {

        for (DataVector::const_iterator it = data.begin(); it != data.end();)
        {
            // Skip inactive data
            if (!it->active)
            {
                ++it;
                continue;
            }

            // Write out data
            stream << it->value;
            ++it;

            // Write out delimiter if not last entry
            if (it != data.end())
            {
                stream << delimiter;
            }
        }
        stream << std::endl;

    }